

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

TimerHolder __thiscall
Liby::EventLoop::runEvery(EventLoop *this,Timestamp *timestamp,BasicHandler *handler)

{
  TimerQueue *this_00;
  Timer *this_01;
  _func_void *p_Var1;
  function<void_()> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TimerHolder TVar2;
  WeakTimerHolder weak_holder;
  Timer timer;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  undefined1 local_168 [40];
  WeakTimerHolder local_140;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Timer local_e8;
  WeakTimerHolder local_b0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Any_data _Stack_50;
  undefined8 uStack_40;
  undefined8 local_38;
  
  _Stack_50._8_8_ = 0;
  uStack_40 = 0;
  local_58 = 0;
  _Stack_50._M_unused._M_object = (void *)0x0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0;
  std::make_shared<Liby::Timer,Liby::Timer_const&>((Timer *)this);
  WeakTimerHolder::WeakTimerHolder(&local_b0,(TimerHolder *)this);
  this_01 = TimerHolder::getTimer((TimerHolder *)this);
  local_168._0_8_ = timestamp;
  std::function<void_()>::function((function<void_()> *)(local_168 + 8),in_RCX);
  WeakTimerHolder::WeakTimerHolder(&local_140,&local_b0);
  local_f8 = *(undefined8 *)&(handler->super__Function_base)._M_functor;
  uStack_f0 = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_178 = (code *)0x0;
  pcStack_170 = (code *)0x0;
  p_Var1 = (_func_void *)operator_new(0x80);
  *(undefined8 *)p_Var1 = local_168._0_8_;
  std::function<void_()>::function
            ((function<void_()> *)(p_Var1 + 8),(function<void_()> *)(local_168 + 8));
  WeakTimerHolder::WeakTimerHolder((WeakTimerHolder *)(p_Var1 + 0x28),&local_140);
  *(undefined8 *)(p_Var1 + 0x70) = local_f8;
  *(undefined8 *)(p_Var1 + 0x78) = uStack_f0;
  pcStack_170 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.cpp:92:31)>
                ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.cpp:92:31)>
              ::_M_manager;
  local_188._M_unused._0_8_ = (undefined8)p_Var1;
  Timer::Timer(&local_e8,(Timestamp *)handler,(BasicHandler *)&local_188);
  Timer::operator=(this_01,&local_e8);
  std::_Function_base::~_Function_base(&local_e8.handler_.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  runEvery(Liby::Timestamp_const&,std::function<void()>const&)::$_0::~__0((__0 *)local_168);
  this_00 = (TimerQueue *)timestamp[1].tv_.tv_sec;
  std::__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_168,
             (__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)this);
  TimerQueue::insert(this_00,(shared_ptr<Liby::Timer> *)local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
  WeakTimerHolder::~WeakTimerHolder(&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&_Stack_50);
  TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder EventLoop::runEvery(const Timestamp &timestamp,
                                const BasicHandler &handler) {
    Timer timer;
    TimerHolder holder(timer);
    WeakTimerHolder weak_holder(holder);
    Timer &timer1 = holder.getTimer();
    timer1 = Timer(timestamp, [this, handler, weak_holder, timestamp] {
        if (!weak_holder.getWeakTimerPtr().expired()) {
            auto timer = weak_holder.getWeakTimerPtr().lock();
            timer->setTimeout(timestamp + Timestamp::now());
            tqueue_->insert(weak_holder.getWeakTimerPtr().lock());
            handler();
        }
    });
    tqueue_->insert(holder.getTimerPtr());
    return holder;
}